

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O2

any __thiscall
cs_impl::
cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&)>
::call(cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_cs::numeric_&,_const_cs::numeric_&)>
       *this,vector *args)

{
  runtime_error *this_00;
  vector *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
            super__Vector_impl_data._M_start == 0x18) {
    cni_helper<std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&),std::__cxx11::string(*)(std::__cxx11::string&,cs::numeric_const&,cs::numeric_const&)>
    ::_call<0,1,2>(&local_c0,args,in_RDX,(sequence<0,_1,_2> *)&cov::make_sequence<0,0,1,2>::result);
    any::make_constant<std::__cxx11::string,std::__cxx11::string_const&>((any *)this,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    return (any)(proxy *)this;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::to_string(&local_80,3);
  std::operator+(&local_60,"Wrong size of the arguments. Expected ",&local_80);
  std::operator+(&local_40,&local_60,", provided ");
  std::__cxx11::to_string
            (&local_a0,
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)(in_RDX->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl
                   .super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_c0,&local_40,&local_a0);
  cs::runtime_error::runtime_error(this_00,&local_c0);
  __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}